

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcursor.c
# Opt level: O1

void set_Xcursor(DspInterface dsp,uint8_t *bitmap,int hotspot_x,int hotspot_y,Cursor *return_cursor,
                int from_lisp)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Cursor CVar4;
  undefined4 in_register_0000000c;
  uchar image [32];
  
  uVar1 = 0;
  if (from_lisp == 0) {
    do {
      image[uVar1] = ""[bitmap[uVar1]];
      uVar1 = uVar1 + 1;
    } while (uVar1 != 0x20);
  }
  else {
    do {
      image[uVar1] = ""[bitmap[uVar1 ^ 3]];
      uVar1 = uVar1 + 1;
    } while (uVar1 != 0x20);
  }
  uVar2 = XCreatePixmapFromBitmapData(dsp->display_id,dsp->DisplayWindow,image,0x10,0x10,1,0,1);
  uVar3 = XCreatePixmapFromBitmapData(dsp->display_id,dsp->DisplayWindow,image,0x10,0x10,1,0,1);
  CVar4 = XCreatePixmapCursor(dsp->display_id,uVar2,uVar3,&cursor_fore_xcsd,&cursor_back_xcsd,
                              hotspot_x,CONCAT44(in_register_0000000c,hotspot_y));
  *return_cursor = CVar4;
  XFreePixmap(dsp->display_id,uVar2);
  XFreePixmap(dsp->display_id,uVar3);
  XFlush(dsp->display_id);
  return;
}

Assistant:

void set_Xcursor(DspInterface dsp, const uint8_t *bitmap, int hotspot_x, int hotspot_y, Cursor *return_cursor, int from_lisp)
{
  extern const unsigned char reversedbits[];
  unsigned char image[32];
  int i;
  Pixmap Cursor_src, Cursor_msk;

#ifdef BYTESWAP
  if (from_lisp)
    for (i = 0; i < 32; i++) image[i] = reversedbits[bitmap[i ^ 3]];
  else
    for (i = 0; i < 32; i++) image[i] = reversedbits[bitmap[i]];
#else
  for (i = 0; i < 32; i++) image[i] = reversedbits[bitmap[i]];
#endif /* BYTESWAP */

  XLOCK;
  Cursor_src = XCreatePixmapFromBitmapData(dsp->display_id, dsp->DisplayWindow, (char *)image,
					   16, 16, 1, 0, 1); /* Has to have a depth of 1! */
  Cursor_msk = XCreatePixmapFromBitmapData(dsp->display_id, dsp->DisplayWindow, (char *)image,
					   16, 16, 1, 0, 1); /* Has to have a depth of 1! */
  *return_cursor = XCreatePixmapCursor(dsp->display_id, Cursor_src, Cursor_msk, &cursor_fore_xcsd,
                                       &cursor_back_xcsd, hotspot_x, hotspot_y);

  /* Should free these now (doc says server may not copy them) */
  XFreePixmap(dsp->display_id, Cursor_src);
  XFreePixmap(dsp->display_id, Cursor_msk);

  XFlush(dsp->display_id);
  XUNLOCK(dsp);

}